

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O3

CborError preparse_next_value(CborValue *it)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  CborError CVar7;
  ushort uVar8;
  uint32_t uVar9;
  byte bVar10;
  byte bVar11;
  ushort uVar12;
  
  if (it->remaining == 0xffffffff || it->type == 0xc0) {
    if (it->type == 0xc0) {
      if (it->remaining == 0xffffffff) {
        puVar2 = (it->source).ptr;
        if ((*(long *)(puVar2 + 0x18) != *(long *)(puVar2 + 0x68)) &&
           (*(char *)(*(long *)(puVar2 + 0x10) + *(long *)(puVar2 + 0x68)) == -1)) {
          CVar7 = CborErrorUnexpectedBreak;
          if (((~it->flags & 0x60) != 0) && (it->type != 0xc0)) {
            it->type = 0xff;
            it->remaining = 0;
            it->flags = it->flags | 0x10;
            CVar7 = CborNoError;
          }
          return CVar7;
        }
      }
      it->type = 0xff;
      bVar10 = it->flags & 0x60;
      it->flags = bVar10;
      puVar2 = (it->source).ptr;
      lVar3 = *(long *)(puVar2 + 0x18);
      lVar4 = *(long *)(puVar2 + 0x68);
      if (lVar3 == lVar4) {
        return CborErrorUnexpectedEOF;
      }
      lVar5 = *(long *)(puVar2 + 0x10);
      bVar1 = *(byte *)(lVar5 + lVar4);
      it->type = bVar1 & 0xe0;
      uVar12 = bVar1 & 0x1f;
      it->extra = uVar12;
      bVar11 = (byte)uVar12;
      if (0x1b < bVar11) {
        if (bVar11 != 0x1f) {
          return (uint)(bVar1 < 0xe0) * 2 + CborErrorUnknownType;
        }
        uVar6 = bVar1 >> 5 ^ 4;
        if ((uVar6 < 8) && ((0xc3U >> uVar6 & 1) != 0)) {
          it->flags = bVar10 | 0x10;
          return CborNoError;
        }
        return (uint)(bVar1 < 0xe0) * 3 + CborErrorUnexpectedBreak;
      }
      uVar6 = 1 << (bVar11 - 0x18 & 0x1f);
      uVar8 = uVar12;
      if (0x17 < bVar11) {
        if ((ulong)(lVar3 - lVar4) <= (ulong)uVar6) {
          return CborErrorUnexpectedEOF;
        }
        it->extra = 0;
        if (uVar6 == 2) {
          uVar8 = *(ushort *)(lVar5 + 1 + lVar4);
          uVar8 = uVar8 << 8 | uVar8 >> 8;
        }
        else {
          if (uVar6 != 1) {
            bVar10 = bVar10 | bVar1 & 3;
            it->flags = bVar10;
            uVar8 = 0;
            goto LAB_0049cf4e;
          }
          uVar8 = (ushort)*(byte *)(lVar5 + 1 + lVar4);
        }
        it->extra = uVar8;
      }
LAB_0049cf4e:
      CVar7 = CborNoError;
      if (bVar1 >> 5 == 7) {
        switch(uVar12) {
        case 0x14:
          it->extra = 0;
          it->type = 0xf5;
          break;
        case 0x18:
          if (uVar8 < 0x20) {
            it->type = 0xff;
            CVar7 = CborErrorIllegalSimpleType;
          }
          break;
        case 0x1a:
        case 0x1b:
          it->flags = bVar10 | 2;
        case 0x15:
        case 0x16:
        case 0x17:
        case 0x19:
          it->type = *(uint8_t *)(*(long *)(puVar2 + 0x10) + *(long *)(puVar2 + 0x68));
        }
      }
      else if (bVar1 >> 5 == 1) {
        it->flags = bVar10 | 4;
        it->type = '\0';
      }
      return CVar7;
    }
  }
  else {
    uVar9 = it->remaining - 1;
    it->remaining = uVar9;
    if (uVar9 == 0) {
      it->type = 0xff;
      it->flags = it->flags & 0xef;
      return CborNoError;
    }
  }
  it->flags = it->flags ^ 0x40;
  CVar7 = preparse_next_value_nodecrement(it);
  return CVar7;
}

Assistant:

static CborError preparse_next_value(CborValue *it)
{
    /* tags don't count towards item totals or whether we've successfully
     * read a map's key or value */
    bool itemCounts = it->type != CborTagType;

    if (it->remaining != UINT32_MAX) {
        if (itemCounts && --it->remaining == 0) {
            it->type = CborInvalidType;
            it->flags &= ~CborIteratorFlag_UnknownLength; /* no Break to consume */
            return CborNoError;
        }
    }
    if (itemCounts) {
        /* toggle the flag indicating whether this was a map key */
        it->flags ^= CborIteratorFlag_NextIsMapKey;
    }
    return preparse_next_value_nodecrement(it);
}